

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QualifierBuilder.h
# Opt level: O2

void __thiscall Refal2::CQualifierBuilder::CQualifierBuilder(CQualifierBuilder *this)

{
  CSetBuilder<char>::CSetBuilder(&this->charsBuilder);
  CSetBuilder<int>::CSetBuilder(&this->labelsBuilder);
  CSetBuilder<unsigned_int>::CSetBuilder(&this->numbersBuilder);
  (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->ansicharsFixed).super__Base_bitset<2UL>._M_w[1] = 0;
  (this->ansichars).super__Base_bitset<2UL>._M_w[0] = 0;
  (this->ansichars).super__Base_bitset<2UL>._M_w[1] = 0;
  Reset(this);
  return;
}

Assistant:

CQualifierBuilder()	{ Reset(); }